

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O1

void embree::avx::SphereMiIntersector1<8,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *sphere)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  uint uVar19;
  uint uVar20;
  Scene *pSVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  float fVar28;
  float fVar31;
  float fVar32;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  float fVar33;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  float fVar43;
  undefined1 auVar36 [32];
  undefined1 auVar44 [36];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [36];
  undefined1 auVar49 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined1 auVar55 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar57 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [28];
  undefined1 auVar60 [64];
  undefined1 auVar61 [28];
  undefined1 auVar62 [64];
  undefined1 auVar63 [28];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [28];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  SphereIntersectorHitM<8> hit;
  int local_30c;
  RTCFilterFunctionNArguments local_308;
  float local_2d4;
  float local_2d0;
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined8 local_2c4;
  uint local_2bc;
  uint local_2b8;
  uint local_2b4;
  uint local_2b0;
  undefined1 local_2a0 [32];
  Scene *local_268;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar50 [64];
  undefined1 auVar56 [64];
  
  pSVar21 = context->scene;
  pGVar6 = (pSVar21->geometries).items[sphere->sharedGeomID].ptr;
  lVar7 = *(long *)&pGVar6->field_0x58;
  _Var8 = pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar24._16_16_ = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[4] * _Var8);
  auVar24._0_16_ = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[0] * _Var8);
  auVar29._16_16_ = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[5] * _Var8);
  auVar29._0_16_ = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[1] * _Var8);
  auVar34._16_16_ = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[6] * _Var8);
  auVar34._0_16_ = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[2] * _Var8);
  auVar45._16_16_ = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[7] * _Var8);
  auVar45._0_16_ = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[3] * _Var8);
  auVar35 = vunpcklps_avx(auVar24,auVar34);
  auVar24 = vunpckhps_avx(auVar24,auVar34);
  auVar13 = vunpcklps_avx(auVar29,auVar45);
  auVar29 = vunpckhps_avx(auVar29,auVar45);
  auVar34 = vunpcklps_avx(auVar35,auVar13);
  auVar35 = vunpckhps_avx(auVar35,auVar13);
  auVar13 = vunpcklps_avx(auVar24,auVar29);
  auVar53 = vunpckhps_avx(auVar24,auVar29);
  local_170 = vpshufd_avx(ZEXT416(sphere->sharedGeomID),0);
  local_180 = local_170;
  aVar5 = (ray->super_RayK<1>).dir.field_0;
  auVar23 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
  auVar10 = vrcpss_avx(auVar23,auVar23);
  auVar23 = ZEXT416((uint)(auVar10._0_4_ * (2.0 - auVar23._0_4_ * auVar10._0_4_)));
  auVar10 = vshufps_avx(auVar23,auVar23,0);
  uVar1 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  auVar51._4_4_ = uVar1;
  auVar51._0_4_ = uVar1;
  auVar51._8_4_ = uVar1;
  auVar51._12_4_ = uVar1;
  auVar51._16_4_ = uVar1;
  auVar51._20_4_ = uVar1;
  auVar51._24_4_ = uVar1;
  auVar51._28_4_ = uVar1;
  auVar24 = vsubps_avx(auVar34,auVar51);
  uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  auVar52._4_4_ = uVar1;
  auVar52._0_4_ = uVar1;
  auVar52._8_4_ = uVar1;
  auVar52._12_4_ = uVar1;
  auVar52._16_4_ = uVar1;
  auVar52._20_4_ = uVar1;
  auVar52._24_4_ = uVar1;
  auVar52._28_4_ = uVar1;
  auVar29 = vsubps_avx(auVar35,auVar52);
  fVar28 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  auVar35._4_4_ = fVar28;
  auVar35._0_4_ = fVar28;
  auVar35._8_4_ = fVar28;
  auVar35._12_4_ = fVar28;
  auVar35._16_4_ = fVar28;
  auVar35._20_4_ = fVar28;
  auVar35._24_4_ = fVar28;
  auVar35._28_4_ = fVar28;
  auVar35 = vsubps_avx(auVar13,auVar35);
  fVar2 = (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar60 = ZEXT3264(CONCAT428(fVar2,CONCAT424(fVar2,CONCAT420(fVar2,CONCAT416(fVar2,CONCAT412(fVar2
                                                  ,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))))))));
  fVar3 = (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar62 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3,CONCAT420(fVar3,CONCAT416(fVar3,CONCAT412(fVar3
                                                  ,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))))))));
  fVar4 = (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar64 = ZEXT3264(CONCAT428(fVar4,CONCAT424(fVar4,CONCAT420(fVar4,CONCAT416(fVar4,CONCAT412(fVar4
                                                  ,CONCAT48(fVar4,CONCAT44(fVar4,fVar4))))))));
  fVar43 = fVar28 + 0.0 + 0.0;
  fVar28 = auVar10._0_4_;
  fVar33 = fVar28 * (fVar2 * auVar24._0_4_ + fVar3 * auVar29._0_4_ + fVar4 * auVar35._0_4_);
  fVar31 = auVar10._4_4_;
  fVar37 = fVar31 * (fVar2 * auVar24._4_4_ + fVar3 * auVar29._4_4_ + fVar4 * auVar35._4_4_);
  auVar12._4_4_ = fVar37;
  auVar12._0_4_ = fVar33;
  fVar32 = auVar10._8_4_;
  fVar38 = fVar32 * (fVar2 * auVar24._8_4_ + fVar3 * auVar29._8_4_ + fVar4 * auVar35._8_4_);
  auVar12._8_4_ = fVar38;
  fVar39 = auVar10._12_4_ *
           (fVar2 * auVar24._12_4_ + fVar3 * auVar29._12_4_ + fVar4 * auVar35._12_4_);
  auVar12._12_4_ = fVar39;
  fVar40 = fVar28 * (fVar2 * auVar24._16_4_ + fVar3 * auVar29._16_4_ + fVar4 * auVar35._16_4_);
  auVar12._16_4_ = fVar40;
  fVar41 = fVar31 * (fVar2 * auVar24._20_4_ + fVar3 * auVar29._20_4_ + fVar4 * auVar35._20_4_);
  auVar12._20_4_ = fVar41;
  fVar42 = fVar32 * (fVar2 * auVar24._24_4_ + fVar3 * auVar29._24_4_ + fVar4 * auVar35._24_4_);
  auVar12._24_4_ = fVar42;
  auVar12._28_4_ = fVar43;
  auVar13._4_4_ = fVar2 * fVar37;
  auVar13._0_4_ = fVar2 * fVar33;
  auVar13._8_4_ = fVar2 * fVar38;
  auVar13._12_4_ = fVar2 * fVar39;
  auVar13._16_4_ = fVar2 * fVar40;
  auVar13._20_4_ = fVar2 * fVar41;
  auVar13._24_4_ = fVar2 * fVar42;
  auVar13._28_4_ = 0;
  auVar57._0_4_ = fVar3 * fVar33;
  auVar57._4_4_ = fVar3 * fVar37;
  auVar57._8_4_ = fVar3 * fVar38;
  auVar57._12_4_ = fVar3 * fVar39;
  auVar57._16_4_ = fVar3 * fVar40;
  auVar57._20_4_ = fVar3 * fVar41;
  auVar57._28_36_ = in_ZMM7._28_36_;
  auVar57._24_4_ = fVar3 * fVar42;
  auVar58._0_4_ = fVar4 * fVar33;
  auVar58._4_4_ = fVar4 * fVar37;
  auVar58._8_4_ = fVar4 * fVar38;
  auVar58._12_4_ = fVar4 * fVar39;
  auVar58._16_4_ = fVar4 * fVar40;
  auVar58._20_4_ = fVar4 * fVar41;
  auVar58._28_36_ = in_ZMM8._28_36_;
  auVar58._24_4_ = fVar4 * fVar42;
  auVar13 = vsubps_avx(auVar24,auVar13);
  auVar65 = ZEXT3264(auVar13);
  auVar34 = vsubps_avx(auVar29,auVar57._0_32_);
  auVar57 = ZEXT3264(auVar34);
  auVar45 = vsubps_avx(auVar35,auVar58._0_32_);
  auVar58 = ZEXT3264(auVar45);
  auVar46._0_4_ =
       auVar13._0_4_ * auVar13._0_4_ + auVar34._0_4_ * auVar34._0_4_ + auVar45._0_4_ * auVar45._0_4_
  ;
  auVar46._4_4_ =
       auVar13._4_4_ * auVar13._4_4_ + auVar34._4_4_ * auVar34._4_4_ + auVar45._4_4_ * auVar45._4_4_
  ;
  auVar46._8_4_ =
       auVar13._8_4_ * auVar13._8_4_ + auVar34._8_4_ * auVar34._8_4_ + auVar45._8_4_ * auVar45._8_4_
  ;
  auVar46._12_4_ =
       auVar13._12_4_ * auVar13._12_4_ +
       auVar34._12_4_ * auVar34._12_4_ + auVar45._12_4_ * auVar45._12_4_;
  auVar46._16_4_ =
       auVar13._16_4_ * auVar13._16_4_ +
       auVar34._16_4_ * auVar34._16_4_ + auVar45._16_4_ * auVar45._16_4_;
  auVar46._20_4_ =
       auVar13._20_4_ * auVar13._20_4_ +
       auVar34._20_4_ * auVar34._20_4_ + auVar45._20_4_ * auVar45._20_4_;
  auVar46._24_4_ =
       auVar13._24_4_ * auVar13._24_4_ +
       auVar34._24_4_ * auVar34._24_4_ + auVar45._24_4_ * auVar45._24_4_;
  auVar46._28_4_ = auVar35._28_4_ + auVar35._28_4_ + auVar24._28_4_;
  auVar11._4_4_ = auVar53._4_4_ * auVar53._4_4_;
  auVar11._0_4_ = auVar53._0_4_ * auVar53._0_4_;
  auVar11._8_4_ = auVar53._8_4_ * auVar53._8_4_;
  auVar11._12_4_ = auVar53._12_4_ * auVar53._12_4_;
  auVar11._16_4_ = auVar53._16_4_ * auVar53._16_4_;
  auVar11._20_4_ = auVar53._20_4_ * auVar53._20_4_;
  auVar11._24_4_ = auVar53._24_4_ * auVar53._24_4_;
  auVar11._28_4_ = auVar53._28_4_;
  auVar24 = vcmpps_avx(auVar46,auVar11,2);
  auVar23 = vpshufd_avx(ZEXT116(sphere->numPrimitives),0);
  auVar53._16_16_ = auVar23;
  auVar53._0_16_ = auVar23;
  auVar29 = vcvtdq2ps_avx(auVar53);
  auVar29 = vcmpps_avx(_DAT_02020f40,auVar29,1);
  auVar35 = auVar29 & auVar24;
  if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar35 >> 0x7f,0) != '\0') ||
        (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar35 >> 0xbf,0) != '\0') ||
      (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar35[0x1f] < '\0') {
    auVar24 = vandps_avx(auVar24,auVar29);
    auVar29 = vsubps_avx(auVar11,auVar46);
    auVar14._4_4_ = fVar31 * auVar29._4_4_;
    auVar14._0_4_ = fVar28 * auVar29._0_4_;
    auVar14._8_4_ = fVar32 * auVar29._8_4_;
    auVar14._12_4_ = auVar10._12_4_ * auVar29._12_4_;
    auVar14._16_4_ = fVar28 * auVar29._16_4_;
    auVar14._20_4_ = fVar31 * auVar29._20_4_;
    auVar14._24_4_ = fVar32 * auVar29._24_4_;
    auVar14._28_4_ = auVar29._28_4_;
    auVar11 = vsqrtps_avx(auVar14);
    auVar67 = ZEXT3264(auVar11);
    auVar12 = vsubps_avx(auVar12,auVar11);
    auVar55._0_4_ = auVar11._0_4_ + fVar33;
    auVar55._4_4_ = auVar11._4_4_ + fVar37;
    auVar55._8_4_ = auVar11._8_4_ + fVar38;
    auVar55._12_4_ = auVar11._12_4_ + fVar39;
    auVar55._16_4_ = auVar11._16_4_ + fVar40;
    auVar55._20_4_ = auVar11._20_4_ + fVar41;
    auVar55._24_4_ = auVar11._24_4_ + fVar42;
    auVar55._28_4_ = auVar11._28_4_ + fVar43;
    auVar56 = ZEXT3264(auVar55);
    auVar23 = SUB3216(*(undefined1 (*) [32])((long)&(ray->super_RayK<1>).org.field_0 + 0xc),0);
    auVar23 = vshufps_avx(auVar23,auVar23,0);
    auVar25._16_16_ = auVar23;
    auVar25._0_16_ = auVar23;
    auVar29 = vcmpps_avx(auVar25,auVar12,2);
    fVar28 = (ray->super_RayK<1>).tfar;
    auVar47._4_4_ = fVar28;
    auVar47._0_4_ = fVar28;
    auVar47._8_4_ = fVar28;
    auVar47._12_4_ = fVar28;
    auVar47._16_4_ = fVar28;
    auVar47._20_4_ = fVar28;
    auVar47._24_4_ = fVar28;
    auVar47._28_4_ = fVar28;
    auVar35 = vcmpps_avx(auVar12,auVar47,2);
    auVar29 = vandps_avx(auVar35,auVar29);
    auVar29 = vandps_avx(auVar29,auVar24);
    auVar54 = ZEXT3264(auVar29);
    auVar35 = vcmpps_avx(auVar25,auVar55,2);
    auVar53 = vcmpps_avx(auVar55,auVar47,2);
    auVar35 = vandps_avx(auVar53,auVar35);
    auVar24 = vandps_avx(auVar35,auVar24);
    auVar68 = ZEXT3264(auVar24);
    auVar24 = vorps_avx(auVar24,auVar29);
    if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar24 >> 0x7f,0) != '\0') ||
          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar24 >> 0xbf,0) != '\0') ||
        (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar24[0x1f] < '\0')
    {
      auVar36._0_8_ = auVar11._0_8_ ^ 0x8000000080000000;
      auVar36._8_4_ = -auVar11._8_4_;
      auVar36._12_4_ = -auVar11._12_4_;
      auVar36._16_4_ = -auVar11._16_4_;
      auVar36._20_4_ = -auVar11._20_4_;
      auVar36._24_4_ = -auVar11._24_4_;
      auVar36._28_4_ = -auVar11._28_4_;
      local_240 = vblendvps_avx(auVar55,auVar12,auVar29);
      auVar69 = ZEXT3264(local_240);
      auVar29 = vblendvps_avx(auVar11,auVar36,auVar29);
      fVar31 = auVar29._0_4_;
      fVar32 = auVar29._4_4_;
      auVar15._4_4_ = fVar2 * fVar32;
      auVar15._0_4_ = fVar2 * fVar31;
      fVar33 = auVar29._8_4_;
      auVar15._8_4_ = fVar2 * fVar33;
      fVar37 = auVar29._12_4_;
      auVar15._12_4_ = fVar2 * fVar37;
      fVar38 = auVar29._16_4_;
      auVar15._16_4_ = fVar2 * fVar38;
      fVar39 = auVar29._20_4_;
      auVar15._20_4_ = fVar2 * fVar39;
      fVar40 = auVar29._24_4_;
      auVar15._24_4_ = fVar2 * fVar40;
      auVar15._28_4_ = auVar36._28_4_;
      auVar16._4_4_ = fVar3 * fVar32;
      auVar16._0_4_ = fVar3 * fVar31;
      auVar16._8_4_ = fVar3 * fVar33;
      auVar16._12_4_ = fVar3 * fVar37;
      auVar16._16_4_ = fVar3 * fVar38;
      auVar16._20_4_ = fVar3 * fVar39;
      auVar16._24_4_ = fVar3 * fVar40;
      auVar16._28_4_ = fVar28;
      auVar17._4_4_ = fVar4 * fVar32;
      auVar17._0_4_ = fVar4 * fVar31;
      auVar17._8_4_ = fVar4 * fVar33;
      auVar17._12_4_ = fVar4 * fVar37;
      auVar17._16_4_ = fVar4 * fVar38;
      auVar17._20_4_ = fVar4 * fVar39;
      auVar17._24_4_ = fVar4 * fVar40;
      auVar17._28_4_ = auVar29._28_4_;
      local_220 = vsubps_avx(auVar15,auVar13);
      local_200 = vsubps_avx(auVar16,auVar34);
      local_1e0 = vsubps_avx(auVar17,auVar45);
      local_2a0 = auVar24;
      auVar49._8_4_ = 0x7f800000;
      auVar49._0_8_ = 0x7f8000007f800000;
      auVar49._12_4_ = 0x7f800000;
      auVar49._16_4_ = 0x7f800000;
      auVar49._20_4_ = 0x7f800000;
      auVar49._24_4_ = 0x7f800000;
      auVar49._28_4_ = 0x7f800000;
      auVar50 = ZEXT3264(auVar49);
      auVar29 = vblendvps_avx(auVar49,local_240,auVar24);
      auVar35 = vshufps_avx(auVar29,auVar29,0xb1);
      auVar35 = vminps_avx(auVar29,auVar35);
      auVar13 = vshufpd_avx(auVar35,auVar35,5);
      auVar35 = vminps_avx(auVar35,auVar13);
      auVar13 = vperm2f128_avx(auVar35,auVar35,1);
      auVar35 = vminps_avx(auVar35,auVar13);
      auVar29 = vcmpps_avx(auVar29,auVar35,0);
      auVar34 = auVar24 & auVar29;
      if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar34 >> 0x7f,0) != '\0') ||
            (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar34 >> 0xbf,0) != '\0') ||
          (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar34[0x1f] < '\0') {
        auVar24 = vandps_avx(auVar29,auVar24);
      }
      uVar19 = vmovmskps_avx(auVar24);
      uVar20 = 0;
      if (uVar19 != 0) {
        for (; (uVar19 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
        }
      }
LAB_010986e4:
      auVar34 = auVar58._0_32_;
      auVar29 = auVar57._0_32_;
      auVar45 = auVar65._0_32_;
      auVar63 = auVar64._0_28_;
      auVar48 = ZEXT436(auVar13._28_4_);
      auVar61 = auVar62._0_28_;
      auVar44 = ZEXT436(auVar35._28_4_);
      auVar66 = auVar67._0_28_;
      auVar59 = auVar60._0_28_;
      auVar53 = auVar68._0_32_;
      auVar24 = auVar54._0_32_;
      uVar22 = (ulong)uVar20;
      local_2b8 = *(uint *)(local_180 + uVar22 * 4);
      pGVar6 = (pSVar21->geometries).items[local_2b8].ptr;
      if ((pGVar6->mask & (ray->super_RayK<1>).mask) == 0) {
        *(undefined4 *)(local_2a0 + uVar22 * 4) = 0;
        auVar44 = ZEXT436(auVar35._28_4_);
        auVar48 = ZEXT436(auVar13._28_4_);
      }
      else {
        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
           (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
          (ray->super_RayK<1>).tfar = *(float *)(local_240 + uVar22 * 4);
          (ray->Ng).field_0.field_0.x = *(float *)(local_220 + uVar22 * 4);
          (ray->Ng).field_0.field_0.y = *(float *)(local_200 + uVar22 * 4);
          (ray->Ng).field_0.field_0.z = *(float *)(local_1e0 + uVar22 * 4);
          ray->u = 0.0;
          ray->v = 0.0;
          ray->primID = (sphere->primIDs).field_0.i[uVar22];
          ray->geomID = local_2b8;
          ray->instID[0] = context->user->instID[0];
          ray->instPrimID[0] = context->user->instPrimID[0];
LAB_01098ad6:
          auVar24 = vandps_avx(auVar53,auVar24);
          fVar28 = (ray->super_RayK<1>).tfar;
          auVar30._4_4_ = fVar28;
          auVar30._0_4_ = fVar28;
          auVar30._8_4_ = fVar28;
          auVar30._12_4_ = fVar28;
          auVar30._16_4_ = fVar28;
          auVar30._20_4_ = fVar28;
          auVar30._24_4_ = fVar28;
          auVar30._28_4_ = fVar28;
          local_240 = auVar56._0_32_;
          auVar35 = vcmpps_avx(local_240,auVar30,2);
          auVar13 = auVar24 & auVar35;
          if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar13 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar13 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar13 >> 0x7f,0) == '\0') &&
                (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar13 >> 0xbf,0) == '\0') &&
              (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar13[0x1f]) {
            return;
          }
          auVar24 = vandps_avx(auVar35,auVar24);
          fVar28 = auVar66._0_4_;
          fVar2 = auVar66._4_4_;
          auVar18._4_4_ = auVar59._4_4_ * fVar2;
          auVar18._0_4_ = auVar59._0_4_ * fVar28;
          fVar3 = auVar66._8_4_;
          auVar18._8_4_ = auVar59._8_4_ * fVar3;
          fVar4 = auVar66._12_4_;
          auVar18._12_4_ = auVar59._12_4_ * fVar4;
          fVar31 = auVar66._16_4_;
          auVar18._16_4_ = auVar59._16_4_ * fVar31;
          fVar32 = auVar66._20_4_;
          auVar18._20_4_ = auVar59._20_4_ * fVar32;
          fVar33 = auVar66._24_4_;
          auVar18._24_4_ = auVar59._24_4_ * fVar33;
          auVar18._28_4_ = auVar35._28_4_;
          auVar60._0_4_ = auVar61._0_4_ * fVar28;
          auVar60._4_4_ = auVar61._4_4_ * fVar2;
          auVar60._8_4_ = auVar61._8_4_ * fVar3;
          auVar60._12_4_ = auVar61._12_4_ * fVar4;
          auVar60._16_4_ = auVar61._16_4_ * fVar31;
          auVar60._20_4_ = auVar61._20_4_ * fVar32;
          auVar60._24_4_ = auVar61._24_4_ * fVar33;
          auVar60._28_36_ = auVar44;
          auVar62._0_4_ = auVar63._0_4_ * fVar28;
          auVar62._4_4_ = auVar63._4_4_ * fVar2;
          auVar62._8_4_ = auVar63._8_4_ * fVar3;
          auVar62._12_4_ = auVar63._12_4_ * fVar4;
          auVar62._16_4_ = auVar63._16_4_ * fVar31;
          auVar62._20_4_ = auVar63._20_4_ * fVar32;
          auVar62._24_4_ = auVar63._24_4_ * fVar33;
          auVar62._28_36_ = auVar48;
          local_220 = vsubps_avx(auVar18,auVar45);
          local_200 = vsubps_avx(auVar60._0_32_,auVar29);
          local_1e0 = vsubps_avx(auVar62._0_32_,auVar34);
          pSVar21 = context->scene;
          local_2a0 = auVar24;
          auVar29 = vblendvps_avx(auVar50._0_32_,local_240,auVar24);
          auVar35 = vshufps_avx(auVar29,auVar29,0xb1);
          auVar35 = vminps_avx(auVar29,auVar35);
          auVar13 = vshufpd_avx(auVar35,auVar35,5);
          auVar35 = vminps_avx(auVar35,auVar13);
          auVar13 = vperm2f128_avx(auVar35,auVar35,1);
          auVar35 = vminps_avx(auVar35,auVar13);
          auVar29 = vcmpps_avx(auVar29,auVar35,0);
          auVar35 = auVar24 & auVar29;
          if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar35 >> 0x7f,0) != '\0') ||
                (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar35 >> 0xbf,0) != '\0') ||
              (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar35[0x1f] < '\0') {
            auVar24 = vandps_avx(auVar29,auVar24);
          }
          uVar19 = vmovmskps_avx(auVar24);
          uVar20 = 0;
          if (uVar19 != 0) {
            for (; (uVar19 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
            }
          }
          do {
            uVar22 = (ulong)uVar20;
            local_2b8 = *(uint *)(local_180 + uVar22 * 4);
            pGVar6 = (pSVar21->geometries).items[local_2b8].ptr;
            if ((pGVar6->mask & (ray->super_RayK<1>).mask) == 0) {
              *(undefined4 *)(local_2a0 + uVar22 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                (ray->super_RayK<1>).tfar = *(float *)(local_240 + uVar22 * 4);
                (ray->Ng).field_0.field_0.x = *(float *)(local_220 + uVar22 * 4);
                (ray->Ng).field_0.field_0.y = *(float *)(local_200 + uVar22 * 4);
                (ray->Ng).field_0.field_0.z = *(float *)(local_1e0 + uVar22 * 4);
                ray->u = 0.0;
                ray->v = 0.0;
                ray->primID = (sphere->primIDs).field_0.i[uVar22];
                ray->geomID = local_2b8;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
                return;
              }
              local_2d0 = *(float *)(local_220 + uVar22 * 4);
              local_2cc = *(undefined4 *)(local_200 + uVar22 * 4);
              local_2c8 = *(undefined4 *)(local_1e0 + uVar22 * 4);
              local_2c4 = 0;
              local_2bc = (sphere->primIDs).field_0.i[uVar22];
              local_2b4 = context->user->instID[0];
              local_2b0 = context->user->instPrimID[0];
              local_1a0._0_4_ = (ray->super_RayK<1>).tfar;
              (ray->super_RayK<1>).tfar = *(float *)(local_240 + uVar22 * 4);
              local_30c = -1;
              local_308.valid = &local_30c;
              local_308.geometryUserPtr = pGVar6->userPtr;
              local_308.context = context->user;
              local_308.ray = (RTCRayN *)ray;
              local_308.hit = (RTCHitN *)&local_2d0;
              local_308.N = 1;
              local_260 = auVar56._0_32_;
              if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01098cb6:
                p_Var9 = context->args->filter;
                if (p_Var9 != (RTCFilterFunctionN)0x0) {
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar6->field_8).field_0x2 & 0x40) != 0)
                     ) {
                    (*p_Var9)(&local_308);
                    auVar50 = ZEXT3264(CONCAT428(0x7f800000,
                                                 CONCAT424(0x7f800000,
                                                           CONCAT420(0x7f800000,
                                                                     CONCAT416(0x7f800000,
                                                                               CONCAT412(0x7f800000,
                                                                                         CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                    auVar56 = ZEXT3264(local_260);
                  }
                  if (*local_308.valid == 0) goto LAB_01098dbf;
                }
                (((Vec3f *)((long)local_308.ray + 0x30))->field_0).field_0.x =
                     *(float *)local_308.hit;
                (((Vec3f *)((long)local_308.ray + 0x30))->field_0).field_0.y =
                     *(float *)(local_308.hit + 4);
                (((Vec3f *)((long)local_308.ray + 0x30))->field_0).field_0.z =
                     *(float *)(local_308.hit + 8);
                *(float *)((long)local_308.ray + 0x3c) = *(float *)(local_308.hit + 0xc);
                *(float *)((long)local_308.ray + 0x40) = *(float *)(local_308.hit + 0x10);
                *(float *)((long)local_308.ray + 0x44) = *(float *)(local_308.hit + 0x14);
                *(float *)((long)local_308.ray + 0x48) = *(float *)(local_308.hit + 0x18);
                *(float *)((long)local_308.ray + 0x4c) = *(float *)(local_308.hit + 0x1c);
                *(float *)((long)local_308.ray + 0x50) = *(float *)(local_308.hit + 0x20);
              }
              else {
                local_1c0._0_8_ = pSVar21;
                (*pGVar6->intersectionFilterN)(&local_308);
                auVar50 = ZEXT3264(CONCAT428(0x7f800000,
                                             CONCAT424(0x7f800000,
                                                       CONCAT420(0x7f800000,
                                                                 CONCAT416(0x7f800000,
                                                                           CONCAT412(0x7f800000,
                                                                                     CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar56 = ZEXT3264(local_260);
                pSVar21 = (Scene *)local_1c0._0_8_;
                if (*local_308.valid != 0) goto LAB_01098cb6;
LAB_01098dbf:
                (ray->super_RayK<1>).tfar = (float)local_1a0._0_4_;
              }
              *(undefined4 *)(local_2a0 + uVar22 * 4) = 0;
              fVar28 = (ray->super_RayK<1>).tfar;
              auVar27._4_4_ = fVar28;
              auVar27._0_4_ = fVar28;
              auVar27._8_4_ = fVar28;
              auVar27._12_4_ = fVar28;
              auVar27._16_4_ = fVar28;
              auVar27._20_4_ = fVar28;
              auVar27._24_4_ = fVar28;
              auVar27._28_4_ = fVar28;
              auVar24 = vcmpps_avx(auVar56._0_32_,auVar27,2);
              local_2a0 = vandps_avx(auVar24,local_2a0);
            }
            if ((((((((local_2a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_2a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_2a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_2a0 >> 0x7f,0) == '\0') &&
                  (local_2a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_2a0 >> 0xbf,0) == '\0') &&
                (local_2a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_2a0[0x1f]) {
              return;
            }
            auVar24 = vblendvps_avx(auVar50._0_32_,auVar56._0_32_,local_2a0);
            auVar29 = vshufps_avx(auVar24,auVar24,0xb1);
            auVar29 = vminps_avx(auVar24,auVar29);
            auVar35 = vshufpd_avx(auVar29,auVar29,5);
            auVar29 = vminps_avx(auVar29,auVar35);
            auVar35 = vperm2f128_avx(auVar29,auVar29,1);
            auVar29 = vminps_avx(auVar29,auVar35);
            auVar29 = vcmpps_avx(auVar24,auVar29,0);
            auVar35 = local_2a0 & auVar29;
            auVar24 = local_2a0;
            if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar35 >> 0x7f,0) != '\0') ||
                  (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar35 >> 0xbf,0) != '\0') ||
                (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar35[0x1f] < '\0') {
              auVar24 = vandps_avx(auVar29,local_2a0);
            }
            uVar19 = vmovmskps_avx(auVar24);
            uVar20 = 0;
            if (uVar19 != 0) {
              for (; (uVar19 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
              }
            }
          } while( true );
        }
        auVar44 = (undefined1  [36])0x0;
        auVar48 = (undefined1  [36])0x0;
        local_2d0 = *(float *)(local_220 + uVar22 * 4);
        local_2cc = *(undefined4 *)(local_200 + uVar22 * 4);
        local_2c8 = *(undefined4 *)(local_1e0 + uVar22 * 4);
        local_2c4 = 0;
        local_2bc = (sphere->primIDs).field_0.i[uVar22];
        local_2b4 = context->user->instID[0];
        local_2b0 = context->user->instPrimID[0];
        local_2d4 = (ray->super_RayK<1>).tfar;
        (ray->super_RayK<1>).tfar = *(float *)(local_240 + uVar22 * 4);
        local_30c = -1;
        local_308.valid = &local_30c;
        local_308.geometryUserPtr = pGVar6->userPtr;
        local_308.context = context->user;
        local_308.ray = (RTCRayN *)ray;
        local_308.hit = (RTCHitN *)&local_2d0;
        local_308.N = 1;
        local_260 = auVar56._0_32_;
        local_1a0 = auVar60._0_32_;
        local_1c0 = auVar62._0_32_;
        local_80 = auVar64._0_32_;
        local_a0 = auVar45;
        local_c0 = auVar29;
        local_e0 = auVar34;
        local_100 = auVar67._0_32_;
        local_120 = auVar24;
        local_140 = auVar53;
        local_160 = auVar69._0_32_;
        if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_010988d0:
          p_Var9 = context->args->filter;
          if (p_Var9 != (RTCFilterFunctionN)0x0) {
            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
              auVar44 = (undefined1  [36])0x0;
              auVar48 = (undefined1  [36])0x0;
              (*p_Var9)(&local_308);
              auVar69 = ZEXT3264(local_160);
              auVar68 = ZEXT3264(local_140);
              auVar54 = ZEXT3264(local_120);
              auVar67 = ZEXT3264(local_100);
              auVar58 = ZEXT3264(local_e0);
              auVar57 = ZEXT3264(local_c0);
              auVar65 = ZEXT3264(local_a0);
              auVar64 = ZEXT3264(local_80);
              auVar62 = ZEXT3264(local_1c0);
              auVar60 = ZEXT3264(local_1a0);
              auVar50 = ZEXT3264(CONCAT428(0x7f800000,
                                           CONCAT424(0x7f800000,
                                                     CONCAT420(0x7f800000,
                                                               CONCAT416(0x7f800000,
                                                                         CONCAT412(0x7f800000,
                                                                                   CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar56 = ZEXT3264(local_260);
            }
            if (*local_308.valid == 0) goto LAB_01098a3b;
          }
          (((Vec3f *)((long)local_308.ray + 0x30))->field_0).field_0.x = *(float *)local_308.hit;
          (((Vec3f *)((long)local_308.ray + 0x30))->field_0).field_0.y =
               *(float *)(local_308.hit + 4);
          (((Vec3f *)((long)local_308.ray + 0x30))->field_0).field_0.z =
               *(float *)(local_308.hit + 8);
          *(float *)((long)local_308.ray + 0x3c) = *(float *)(local_308.hit + 0xc);
          *(float *)((long)local_308.ray + 0x40) = *(float *)(local_308.hit + 0x10);
          *(float *)((long)local_308.ray + 0x44) = *(float *)(local_308.hit + 0x14);
          *(float *)((long)local_308.ray + 0x48) = *(float *)(local_308.hit + 0x18);
          *(float *)((long)local_308.ray + 0x4c) = *(float *)(local_308.hit + 0x1c);
          *(float *)((long)local_308.ray + 0x50) = *(float *)(local_308.hit + 0x20);
        }
        else {
          auVar44 = (undefined1  [36])0x0;
          auVar48 = (undefined1  [36])0x0;
          local_268 = pSVar21;
          (*pGVar6->intersectionFilterN)(&local_308);
          auVar69 = ZEXT3264(local_160);
          auVar68 = ZEXT3264(local_140);
          auVar54 = ZEXT3264(local_120);
          auVar67 = ZEXT3264(local_100);
          auVar58 = ZEXT3264(local_e0);
          auVar57 = ZEXT3264(local_c0);
          auVar65 = ZEXT3264(local_a0);
          auVar64 = ZEXT3264(local_80);
          auVar62 = ZEXT3264(local_1c0);
          auVar60 = ZEXT3264(local_1a0);
          auVar50 = ZEXT3264(CONCAT428(0x7f800000,
                                       CONCAT424(0x7f800000,
                                                 CONCAT420(0x7f800000,
                                                           CONCAT416(0x7f800000,
                                                                     CONCAT412(0x7f800000,
                                                                               CONCAT48(0x7f800000,
                                                                                                                                                                                
                                                  0x7f8000007f800000)))))));
          auVar56 = ZEXT3264(local_260);
          pSVar21 = local_268;
          if (*local_308.valid != 0) goto LAB_010988d0;
LAB_01098a3b:
          (ray->super_RayK<1>).tfar = local_2d4;
        }
        *(undefined4 *)(local_2a0 + uVar22 * 4) = 0;
        fVar28 = (ray->super_RayK<1>).tfar;
        auVar26._4_4_ = fVar28;
        auVar26._0_4_ = fVar28;
        auVar26._8_4_ = fVar28;
        auVar26._12_4_ = fVar28;
        auVar26._16_4_ = fVar28;
        auVar26._20_4_ = fVar28;
        auVar26._24_4_ = fVar28;
        auVar26._28_4_ = fVar28;
        auVar24 = vcmpps_avx(auVar69._0_32_,auVar26,2);
        local_2a0 = vandps_avx(auVar24,local_2a0);
      }
      auVar34 = auVar58._0_32_;
      auVar29 = auVar57._0_32_;
      auVar45 = auVar65._0_32_;
      auVar63 = auVar64._0_28_;
      auVar61 = auVar62._0_28_;
      auVar66 = auVar67._0_28_;
      auVar59 = auVar60._0_28_;
      auVar53 = auVar68._0_32_;
      auVar24 = auVar54._0_32_;
      if ((((((((local_2a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_2a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_2a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_2a0 >> 0x7f,0) == '\0') &&
            (local_2a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_2a0 >> 0xbf,0) == '\0') &&
          (local_2a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_2a0[0x1f]) goto LAB_01098ad6;
      auVar24 = vblendvps_avx(auVar50._0_32_,auVar69._0_32_,local_2a0);
      auVar29 = vshufps_avx(auVar24,auVar24,0xb1);
      auVar29 = vminps_avx(auVar24,auVar29);
      auVar35 = vshufpd_avx(auVar29,auVar29,5);
      auVar29 = vminps_avx(auVar29,auVar35);
      auVar13 = vperm2f128_avx(auVar29,auVar29,1);
      auVar35 = vminps_avx(auVar29,auVar13);
      auVar29 = vcmpps_avx(auVar24,auVar35,0);
      auVar34 = local_2a0 & auVar29;
      auVar24 = local_2a0;
      if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar34 >> 0x7f,0) != '\0') ||
            (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar34 >> 0xbf,0) != '\0') ||
          (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar34[0x1f] < '\0') {
        auVar24 = vandps_avx(auVar29,local_2a0);
      }
      uVar19 = vmovmskps_avx(auVar24);
      uVar20 = 0;
      if (uVar19 != 0) {
        for (; (uVar19 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
        }
      }
      goto LAB_010986e4;
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre,
                                          RayHit& ray,
                                          RayQueryContext* context,
                                          const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        SphereIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, Intersect1EpilogM<M, filter>(ray, context, sphere.geomID(), sphere.primID()));
      }